

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall CmdLineParser::onSwitch(CmdLineParser *this,SwitchKind switchKind,StringRef *value)

{
  C *pCVar1;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this_00;
  int in_ESI;
  
  this_00 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)(ulong)(in_ESI - 1);
  switch(this_00) {
  case (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x0:
    printf("CmdLineSwitchKind_Help\n");
    break;
  case (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1:
    printf("CmdLineSwitchKind_Version\n");
    break;
  case (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x2:
    printf("CmdLineSwitchKind_Verbose\n");
    break;
  case (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x3:
    pCVar1 = axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(this_00);
    printf("CmdLineSwitchKind_Add (%s)\n",pCVar1);
    break;
  case (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x4:
    pCVar1 = axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(this_00);
    printf("CmdLineSwitchKind_Remove (%s)\n",pCVar1);
  }
  return true;
}

Assistant:

bool
	onSwitch(
		SwitchKind switchKind,
		const sl::StringRef& value
	) {
		switch (switchKind) {
		case CmdLineSwitchKind_Help:
			printf("CmdLineSwitchKind_Help\n");
			break;

		case CmdLineSwitchKind_Version:
			printf("CmdLineSwitchKind_Version\n");
			break;

		case CmdLineSwitchKind_Verbose:
			printf("CmdLineSwitchKind_Verbose\n");
			break;

		case CmdLineSwitchKind_Add:
			printf("CmdLineSwitchKind_Add (%s)\n", value.sz());
			break;

		case CmdLineSwitchKind_Remove:
			printf("CmdLineSwitchKind_Remove (%s)\n", value.sz());
			break;

		};

		return true;
	}